

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

Own<kj::WebSocket> * __thiscall
kj::Own<kj::WebSocket>::operator=(Own<kj::WebSocket> *this,Own<kj::WebSocket> *other)

{
  Disposer *object;
  Dispose_<kj::WebSocket,_true> *this_00;
  WebSocket *pWVar1;
  Disposer *in_RDX;
  
  object = this->disposer;
  this_00 = (Dispose_<kj::WebSocket,_true> *)this->ptr;
  pWVar1 = other->ptr;
  this->disposer = other->disposer;
  this->ptr = pWVar1;
  other->ptr = (WebSocket *)0x0;
  if (this_00 != (Dispose_<kj::WebSocket,_true> *)0x0) {
    Disposer::Dispose_<kj::WebSocket,_true>::dispose(this_00,(WebSocket *)object,in_RDX);
  }
  return this;
}

Assistant:

inline Own& operator=(Own&& other) {
    // Move-assingnment operator.

    // Careful, this might own `other`.  Therefore we have to transfer the pointers first, then
    // dispose.
    const Disposer* disposerCopy = disposer;
    T* ptrCopy = ptr;
    disposer = other.disposer;
    ptr = other.ptr;
    other.ptr = nullptr;
    if (ptrCopy != nullptr) {
      disposerCopy->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
    return *this;
  }